

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bread(bNread readPtr,void *parm)

{
  int iVar1;
  bstring b;
  
  if ((readPtr != (bNread)0x0) && (b = bfromcstr(""), b != (bstring)0x0)) {
    iVar1 = breada(b,readPtr,parm);
    if (-1 < iVar1) {
      return b;
    }
    bdestroy(b);
  }
  return (bstring)0x0;
}

Assistant:

bstring bread (bNread readPtr, void * parm) {
int ret;
bstring buff;

	if (readPtr == NULL) return NULL;
	buff = bfromcstr ("");
	if (buff == NULL) return NULL;
	ret = breada (buff, readPtr, parm);
	if (ret < 0) {
		bdestroy (buff);
		return NULL;
	}
	return buff;
}